

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  GeneratorOptions *options_00;
  Printer *printer_00;
  __type _Var2;
  FileDescriptor *pFVar3;
  long lVar4;
  difference_type dVar5;
  _Rb_tree_node_base *p_Var6;
  string *psVar7;
  GeneratorOptions *file_00;
  GeneratorOptions *options_01;
  FileToc *pFVar8;
  int index;
  _Rb_tree_node_base *this_00;
  long lVar9;
  bool bVar10;
  string result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  GeneratorOptions *local_138;
  GeneratorOptions *local_130;
  Printer *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  _Rb_tree_node_base *local_e0;
  undefined1 local_d8 [32];
  _Base_ptr local_b8;
  size_t local_b0;
  string local_a8;
  undefined1 local_80 [32];
  _Rb_tree_node_base *local_60;
  size_t local_58;
  string local_50;
  
  psVar7 = (string *)file;
  local_138 = (GeneratorOptions *)file;
  local_e0 = (_Rb_tree_node_base *)this;
  io::Printer::Print(printer,
                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                    );
  local_130 = options;
  local_128 = printer;
  if (options->import_style == kImportCommonJs) {
    io::Printer::Print(printer,"var jspb = require(\'google-protobuf\');\n");
    io::Printer::Print(printer,"var goog = jspb;\n");
    io::Printer::Print(printer,"var global = Function(\'return this\')();\n\n");
    for (index = 0; index < *(int *)((long)&(((GeneratorOptions *)file)->output_dir).field_2 + 8);
        index = index + 1) {
      pFVar3 = FileDescriptor::dependency(file,index);
      psVar7 = *(string **)pFVar3;
      anon_unknown_0::ModuleAlias((string *)local_d8,psVar7);
      pcVar1 = (local_138->output_dir)._M_dataplus._M_p;
      lVar4 = std::__cxx11::string::find((char *)psVar7,0x34bf14);
      if (lVar4 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"google-protobuf/",(allocator<char> *)&local_100);
      }
      else {
        __first._M_current = *(char **)pcVar1;
        local_100._M_dataplus._M_p._0_1_ = 0x2f;
        dVar5 = std::
                __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(__first._M_current + *(long *)(pcVar1 + 8)),
                           (_Iter_equals_val<const_char>)&local_100);
        if (dVar5 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"./",(allocator<char> *)&local_100);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"",(allocator<char> *)&local_100);
          while (bVar10 = dVar5 != 0, dVar5 = dVar5 + -1, bVar10) {
            std::__cxx11::string::append((char *)&local_120);
          }
        }
      }
      anon_unknown_0::GetJSFilename(&local_100,local_130,psVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_120,&local_100);
      psVar7 = (string *)local_d8;
      io::Printer::Print(local_128,"var $alias$ = require(\'$file$\');\n","alias",(string *)local_d8
                         ,"file",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)local_d8);
      file = (FileDescriptor *)local_138;
    }
  }
  local_d8._24_8_ = local_d8 + 8;
  local_d8._8_4_ = _S_red;
  local_d8._16_8_ = 0;
  local_b0 = 0;
  local_80._24_8_ = local_80 + 8;
  local_80._8_4_ = _S_red;
  local_80._16_8_ = 0;
  local_58 = 0;
  lVar9 = 0;
  local_b8 = (_Base_ptr)local_d8._24_8_;
  local_60 = (_Rb_tree_node_base *)local_80._24_8_;
  for (lVar4 = 0; this_00 = local_e0, printer_00 = local_128, options_00 = local_130,
      lVar4 < *(int *)&(((GeneratorOptions *)file)->extension).field_2; lVar4 = lVar4 + 1) {
    if ((local_130->import_style != kImportClosure) ||
       (bVar10 = anon_unknown_0::IgnoreField
                           ((FieldDescriptor *)
                            (*(long *)&((GeneratorOptions *)file)->one_output_file_per_input_file +
                            lVar9)), file = (FileDescriptor *)local_138, !bVar10)) {
      (anonymous_namespace)::GetFilePath_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)local_130,(GeneratorOptions *)file,
                 (FileDescriptor *)psVar7);
      std::operator+(&local_100,&local_50,".");
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_a8,
                 (_anonymous_namespace_ *)
                 (*(long *)&local_138->one_output_file_per_input_file + lVar9),options_01,
                 (FieldDescriptor *)psVar7);
      std::operator+(&local_120,&local_100,&local_a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_d8,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_50);
      local_120._M_dataplus._M_p =
           (pointer)(*(long *)&local_138->one_output_file_per_input_file + lVar9);
      std::
      _Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_insert_unique<google::protobuf::FieldDescriptor_const*>
                ((_Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)local_80,(FieldDescriptor **)&local_120);
    }
    lVar9 = lVar9 + 0xa8;
    file = (FileDescriptor *)local_138;
  }
  p_Var6 = local_e0;
  FindProvidesForFile((Generator *)local_e0,local_130,local_128,file,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8);
  GenerateProvides((Generator *)p_Var6,options_00,printer_00,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8);
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)&local_a8,(value_type *)&local_138);
  if (options_00->import_style == kImportClosure) {
    GenerateRequiresForLibrary
              ((Generator *)this_00,options_00,printer_00,
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_a8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8);
  }
  file_00 = local_138;
  GenerateClassesAndEnums((Generator *)this_00,options_00,printer_00,(FileDescriptor *)local_138);
  for (p_Var6 = (_Rb_tree_node_base *)local_80._24_8_;
      p_Var6 != (_Rb_tree_node_base *)(local_80 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    file_00 = *(GeneratorOptions **)(p_Var6 + 1);
    GenerateExtension((Generator *)this_00,options_00,printer_00,(FieldDescriptor *)file_00);
    this_00 = p_Var6;
  }
  if (options_00->import_style == kImportCommonJs) {
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&local_120,(_anonymous_namespace_ *)options_00,local_138,(FileDescriptor *)file_00);
    io::Printer::Print(printer_00,"goog.object.extend(exports, $package$);\n","package",&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  for (pFVar8 = well_known_types_js; pFVar8->name != (char *)0x0; pFVar8 = pFVar8 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"google/protobuf/",(allocator<char> *)&local_50);
    std::operator+(&local_120,&local_100,pFVar8->name);
    std::__cxx11::string::~string((string *)&local_100);
    anon_unknown_0::StripProto(&local_50,(string *)(local_138->output_dir)._M_dataplus._M_p);
    std::operator+(&local_100,&local_50,".js");
    _Var2 = std::operator==(&local_120,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) {
      io::Printer::Print(local_128,pFVar8->data);
    }
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base((_Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&local_a8);
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  return;
}

Assistant:

void Generator::GenerateFile(const GeneratorOptions& options,
                             io::Printer* printer,
                             const FileDescriptor* file) const {
  GenerateHeader(options, printer);

  // Generate "require" statements.
  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("var jspb = require('google-protobuf');\n");
    printer->Print("var goog = jspb;\n");
    printer->Print("var global = Function('return this')();\n\n");

    for (int i = 0; i < file->dependency_count(); i++) {
      const string& name = file->dependency(i)->name();
      printer->Print(
          "var $alias$ = require('$file$');\n",
          "alias", ModuleAlias(name),
          "file", GetRootPath(file->name(), name) + GetJSFilename(options, name));
    }
  }

  std::set<string> provided;
  std::set<const FieldDescriptor*> extensions;
  for (int i = 0; i < file->extension_count(); i++) {
    // We honor the jspb::ignore option here only when working with
    // Closure-style imports. Use of this option is discouraged and so we want
    // to avoid adding new support for it.
    if (options.import_style == GeneratorOptions::kImportClosure &&
        IgnoreField(file->extension(i))) {
      continue;
    }
    provided.insert(GetFilePath(options, file) + "." +
                    JSObjectFieldName(options, file->extension(i)));
    extensions.insert(file->extension(i));
  }

  FindProvidesForFile(options, printer, file, &provided);
  GenerateProvides(options, printer, &provided);
  std::vector<const FileDescriptor*> files;
  files.push_back(file);
  if (options.import_style == GeneratorOptions::kImportClosure) {
    GenerateRequiresForLibrary(options, printer, files, &provided);
  }

  GenerateClassesAndEnums(options, printer, file);

  // Generate code for top-level extensions. Extensions nested inside messages
  // are emitted inside GenerateClassesAndEnums().
  for (std::set<const FieldDescriptor*>::const_iterator it = extensions.begin();
       it != extensions.end(); ++it) {
    GenerateExtension(options, printer, *it);
  }

  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("goog.object.extend(exports, $package$);\n",
                   "package", GetFilePath(options, file));
  }

  // Emit well-known type methods.
  for (FileToc* toc = well_known_types_js; toc->name != NULL; toc++) {
    string name = string("google/protobuf/") + toc->name;
    if (name == StripProto(file->name()) + ".js") {
      printer->Print(toc->data);
    }
  }
}